

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_CallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  Var value;
  RecyclableObject *function;
  
  value = *(Var *)(this + (ulong)playout->Function * 8 + 0x160);
  ValidateRegValue(this,value,true,true);
  function = JavascriptOperators::GetCallableObjectOrThrow(value,*(ScriptContext **)(this + 0x78));
  OP_CallCommon<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
            (this,playout,function,0,(AuxArray<unsigned_int> *)0x0);
  return;
}

Assistant:

void OP_CallI(const unaligned T* playout) { OP_CallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None); }